

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

bool __thiscall
Js::SourceDynamicProfileManager::Serialize<Js::BufferWriter>
          (SourceDynamicProfileManager *this,BufferWriter *writer)

{
  DynamicProfileInfo *this_00;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  BVIndex BVar4;
  BVIndex BVar5;
  int iVar6;
  BVFixed **ppBVar7;
  BVFixed *pBVar8;
  DynamicProfileInfo **ppDVar9;
  byte local_51;
  DynamicProfileInfo *dynamicProfileInfo;
  int i;
  size_t bvSize;
  BufferWriter *writer_local;
  SourceDynamicProfileManager *this_local;
  
  bvSize = (size_t)writer;
  writer_local = (BufferWriter *)this;
  ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                      ((WriteBarrierPtr *)&this->startupFunctions);
  if (*ppBVar7 == (BVFixed *)0x0) {
    ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                        ((WriteBarrierPtr *)&this->cachedStartupFunctions);
    Memory::WriteBarrierPtr<BVFixed>::operator=(&this->startupFunctions,*ppBVar7);
  }
  else {
    ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                        ((WriteBarrierPtr *)&this->cachedStartupFunctions);
    if (*ppBVar7 != (BVFixed *)0x0) {
      pBVar8 = Memory::WriteBarrierPtr<const_BVFixed>::operator->(&this->cachedStartupFunctions);
      BVar5 = BVFixed::Length(pBVar8);
      pBVar8 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
      BVar4 = BVFixed::Length(pBVar8);
      if (BVar5 == BVar4) {
        pBVar8 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
        ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                            ((WriteBarrierPtr *)&this->cachedStartupFunctions);
        BVFixed::Or(pBVar8,*ppBVar7);
      }
    }
  }
  ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                      ((WriteBarrierPtr *)&this->startupFunctions);
  if (*ppBVar7 != (BVFixed *)0x0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01ea1258,DynamicProfilePhase);
    if (bVar3) {
      Output::Print(L"Saving: Startup functions bit vector:");
      pBVar8 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
      BVFixed::Dump(pBVar8);
    }
    pBVar8 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
    BVar5 = BVFixed::Length(pBVar8);
    _i = BVFixed::GetAllocSize(BVar5);
    sVar2 = bvSize;
    ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                        ((WriteBarrierPtr *)&this->startupFunctions);
    bVar3 = BufferWriter::WriteArray<char>((BufferWriter *)sVar2,(char *)*ppBVar7,_i);
    sVar2 = bvSize;
    local_51 = 1;
    if (bVar3) {
      dynamicProfileInfo._4_4_ =
           JsUtil::
           BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Count(&this->dynamicProfileInfoMapSaving);
      bVar3 = BufferWriter::Write<int>((BufferWriter *)sVar2,(int *)((long)&dynamicProfileInfo + 4))
      ;
      local_51 = bVar3 ^ 0xff;
    }
    if ((local_51 & 1) != 0) {
      return false;
    }
  }
  dynamicProfileInfo._0_4_ = 0;
  while( true ) {
    iVar1 = (int)dynamicProfileInfo;
    iVar6 = JsUtil::
            BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(&this->dynamicProfileInfoMapSaving);
    if (iVar6 <= iVar1) {
      return true;
    }
    ppDVar9 = JsUtil::
              BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(&this->dynamicProfileInfoMapSaving,(int)dynamicProfileInfo);
    this_00 = *ppDVar9;
    if (((this_00 != (DynamicProfileInfo *)0x0) &&
        (bVar3 = DynamicProfileInfo::HasFunctionBody(this_00), bVar3)) &&
       (bVar3 = DynamicProfileInfo::Serialize<Js::BufferWriter>(this_00,(BufferWriter *)bvSize),
       !bVar3)) break;
    dynamicProfileInfo._0_4_ = (int)dynamicProfileInfo + 1;
  }
  return false;
}

Assistant:

bool
    SourceDynamicProfileManager::Serialize(T * writer)
    {
        // To simulate behavior of in memory profile cache - let's keep functions marked as executed if they were loaded
        // to be so from the profile - this helps with ensure inlined functions are marked as executed.
        if(!this->startupFunctions)
        {
            this->startupFunctions = const_cast<BVFixed*>(static_cast<const BVFixed*>(this->cachedStartupFunctions));
        }
        else if(cachedStartupFunctions && this->cachedStartupFunctions->Length() == this->startupFunctions->Length())
        {
            this->startupFunctions->Or(cachedStartupFunctions);
        }

        if(this->startupFunctions)
        {
#if DBG_DUMP
             if(Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase))
            {
                Output::Print(_u("Saving: Startup functions bit vector:"));
                this->startupFunctions->Dump();
            }
#endif

            size_t bvSize = BVFixed::GetAllocSize(this->startupFunctions->Length()) ;
            if (!writer->WriteArray((char *)static_cast<BVFixed*>(this->startupFunctions), bvSize)
                || !writer->Write(this->dynamicProfileInfoMapSaving.Count()))
            {
                return false;
            }
        }

        for (int i = 0; i < this->dynamicProfileInfoMapSaving.Count(); i++)
        {
            DynamicProfileInfo * dynamicProfileInfo = this->dynamicProfileInfoMapSaving.GetValueAt(i);
            if (dynamicProfileInfo == nullptr || !dynamicProfileInfo->HasFunctionBody())
            {
                continue;
            }

            if (!dynamicProfileInfo->Serialize(writer))
            {
                return false;
            }
        }
        return true;
    }